

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

int __thiscall MobileElementManager::Choose(MobileElementManager *this)

{
  int __val;
  runtime_error *prVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string err;
  
  if ((this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::to_string(&local_50,this->prop_sum_);
    std::operator+(&local_70,"There are no active polymerases on polymer (propensity sum: ",
                   &local_50);
    std::operator+(&err,&local_70,").");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,(string *)&err);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __val = Random::
          WeightedChoiceIndex<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>
                    (&this->polymerases_,&this->prop_list_);
  if ((ulong)(long)__val <
      (ulong)((long)(this->polymerases_).
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->polymerases_).
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    if ((ulong)(long)__val <
        (ulong)((long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3)) {
      return __val;
    }
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Prop list vector index is invalid (before move).");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::to_string(&local_50,__val);
  std::operator+(&local_70,"Attempting to move unbound polymerase with index ",&local_50);
  std::operator+(&err,&local_70," on polymer.");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar1,(string *)&err);
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int MobileElementManager::Choose() {
  /*for (int i = 0; i < prop_list_.size(); i++) {
    std::cout << i << " :" << prop_list_[i] << std::endl;
  }*/
  if (prop_list_.size() == 0) {
    std::string err =
        "There are no active polymerases on polymer (propensity sum: " +
        std::to_string(prop_sum_) + ").";
    throw std::runtime_error(err);
  }
  int pol_index = Random::WeightedChoiceIndex(polymerases_, prop_list_);
  // std::cout << "chosen index :" << pol_index << std::endl;
  // Error checking to make sure that pol is in vector
  if (pol_index >= polymerases_.size()) {
    std::string err = "Attempting to move unbound polymerase with index " +
                      std::to_string(pol_index) + " on polymer.";
    throw std::runtime_error(err);
  }
  if (pol_index >= prop_list_.size()) {
    throw std::runtime_error(
        "Prop list vector index is invalid (before move).");
  }
  return pol_index;
}